

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturm.h
# Opt level: O0

int modp(poly *u,poly *v,poly *r)

{
  int iVar1;
  bool bVar2;
  int local_48;
  double *local_40;
  double *uc;
  double *end;
  double *nr;
  int k;
  int j;
  poly *r_local;
  poly *v_local;
  poly *u_local;
  
  iVar1 = u->ord;
  local_40 = u->coef;
  end = r->coef;
  while (local_40 <= u->coef + iVar1) {
    *end = *local_40;
    local_40 = local_40 + 1;
    end = end + 1;
  }
  if (0.0 < v->coef[v->ord] || v->coef[v->ord] == 0.0) {
    for (nr._0_4_ = u->ord - v->ord; -1 < (int)nr; nr._0_4_ = (int)nr + -1) {
      nr._4_4_ = v->ord + (int)nr;
      while (nr._4_4_ = nr._4_4_ + -1, (int)nr <= nr._4_4_) {
        r->coef[nr._4_4_] =
             -r->coef[v->ord + (int)nr] * v->coef[nr._4_4_ - (int)nr] + r->coef[nr._4_4_];
      }
    }
  }
  else {
    for (nr._0_4_ = (u->ord - v->ord) + -1; -1 < (int)nr; nr._0_4_ = (int)nr + -2) {
      r->coef[(int)nr] = -r->coef[(int)nr];
    }
    for (nr._0_4_ = u->ord - v->ord; -1 < (int)nr; nr._0_4_ = (int)nr + -1) {
      nr._4_4_ = v->ord + (int)nr;
      while (nr._4_4_ = nr._4_4_ + -1, (int)nr <= nr._4_4_) {
        r->coef[nr._4_4_] =
             -r->coef[v->ord + (int)nr] * v->coef[nr._4_4_ - (int)nr] + -r->coef[nr._4_4_];
      }
    }
  }
  nr._0_4_ = v->ord;
  while( true ) {
    nr._0_4_ = (int)nr + -1;
    bVar2 = false;
    if (-1 < (int)nr) {
      bVar2 = ABS(r->coef[(int)nr]) < 1e-12;
    }
    if (!bVar2) break;
    r->coef[(int)nr] = 0.0;
  }
  if ((int)nr < 0) {
    local_48 = 0;
  }
  else {
    local_48 = (int)nr;
  }
  r->ord = local_48;
  return r->ord;
}

Assistant:

static int modp(poly *u, poly *v, poly *r)
{
	int j, k;  /* Loop indices */

	double *nr = r->coef;
	double *end = &u->coef[u->ord];

	double *uc = u->coef;
	while (uc <= end)
		*nr++ = *uc++;

	if (v->coef[v->ord] < 0.0) {

		for (k = u->ord - v->ord - 1; k >= 0; k -= 2)
			r->coef[k] = -r->coef[k];

		for (k = u->ord - v->ord; k >= 0; k--)
			for (j = v->ord + k - 1; j >= k; j--)
				r->coef[j] = -r->coef[j] - r->coef[v->ord + k]
				* v->coef[j - k];
	}
	else {
		for (k = u->ord - v->ord; k >= 0; k--)
			for (j = v->ord + k - 1; j >= k; j--)
				r->coef[j] -= r->coef[v->ord + k] * v->coef[j - k];
	}

	k = v->ord - 1;
	while (k >= 0 && fabs(r->coef[k]) < SMALL_ENOUGH) {
		r->coef[k] = 0.0;
		k--;
	}

	r->ord = (k < 0) ? 0 : k;

	return(r->ord);
}